

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QCss::BasicSelector>::moveAppend
          (QGenericArrayOps<QCss::BasicSelector> *this,BasicSelector *b,BasicSelector *e)

{
  qsizetype *pqVar1;
  BasicSelector *pBVar2;
  
  if (b != e) {
    pBVar2 = (this->super_QArrayDataPointer<QCss::BasicSelector>).ptr;
    for (; b < e; b = b + 1) {
      QCss::BasicSelector::BasicSelector
                (pBVar2 + (this->super_QArrayDataPointer<QCss::BasicSelector>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QCss::BasicSelector>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }